

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_operator_suite.cpp
# Opt level: O0

void append_suite::append_boolean_with_integer(void)

{
  undefined1 local_51e;
  undefined1 local_51d [2];
  undefined1 local_51b;
  undefined1 local_51a [2];
  basic_variable<std::allocator<char>_> local_518;
  undefined1 local_4de;
  undefined1 local_4dd [2];
  undefined1 local_4db;
  undefined1 local_4da [2];
  undefined1 local_4d8 [8];
  variable data_9;
  unsigned_long_long value_9;
  basic_variable<std::allocator<char>_> local_498;
  undefined1 local_45e;
  undefined1 local_45d [2];
  undefined1 local_45b;
  undefined1 local_45a [2];
  undefined1 local_458 [8];
  variable data_8;
  longlong value_8;
  basic_variable<std::allocator<char>_> local_418;
  undefined1 local_3de;
  undefined1 local_3dd [2];
  undefined1 local_3db;
  undefined1 local_3da [2];
  undefined1 local_3d8 [8];
  variable data_7;
  unsigned_long value_7;
  basic_variable<std::allocator<char>_> local_398;
  undefined1 local_35e;
  undefined1 local_35d [2];
  undefined1 local_35b;
  undefined1 local_35a [2];
  undefined1 local_358 [8];
  variable data_6;
  long value_6;
  basic_variable<std::allocator<char>_> local_318;
  undefined1 local_2de;
  undefined1 local_2dd [2];
  undefined1 local_2db;
  undefined1 local_2da [2];
  undefined1 local_2d8 [8];
  variable data_5;
  undefined1 local_29e;
  undefined1 local_29d;
  uint value_5;
  basic_variable<std::allocator<char>_> local_298;
  undefined1 local_25e;
  undefined1 local_25d [2];
  undefined1 local_25b;
  undefined1 local_25a [2];
  undefined1 local_258 [8];
  variable data_4;
  undefined1 local_21e;
  undefined1 local_21d;
  int value_4;
  basic_variable<std::allocator<char>_> local_218;
  undefined1 local_1de;
  undefined1 local_1dd [2];
  undefined1 local_1db;
  undefined1 local_1da [2];
  undefined1 local_1d8 [8];
  variable data_3;
  undefined1 local_19e;
  undefined1 local_19d [2];
  undefined1 local_19b;
  undefined1 local_19a [2];
  unsigned_short value_3;
  undefined1 local_15e;
  undefined1 local_15d [2];
  undefined1 local_15b;
  undefined1 local_15a [2];
  undefined1 local_158 [8];
  variable data_2;
  undefined1 local_11e;
  undefined1 local_11d [2];
  undefined1 local_11b;
  undefined1 local_11a [2];
  short value_2;
  undefined1 local_de;
  undefined1 local_dd [2];
  undefined1 local_db;
  undefined1 local_da [2];
  undefined1 local_d8 [8];
  variable data_1;
  undefined1 local_9e;
  undefined1 local_9d [2];
  undefined1 local_9b;
  undefined1 local_9a [2];
  undefined1 local_98;
  uchar value_1;
  undefined1 local_5f;
  undefined1 local_5e [19];
  undefined1 local_4b;
  undefined1 local_4a [2];
  undefined1 local_48 [8];
  variable data;
  char value;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)local_48,false);
  local_4a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<bool>
                          ((basic_variable<std::allocator<char>_> *)local_48);
  local_4b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<bool>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x11e,"void append_suite::append_boolean_with_integer()",local_4a,&local_4b);
  local_5e[0] = trial::dynamic::basic_variable<std::allocator<char>_>::value<bool>
                          ((basic_variable<std::allocator<char>_> *)local_48);
  local_5f = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.value<bool>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x11f,"void append_suite::append_boolean_with_integer()",local_5e,&local_5f);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<signed_char>
            ((basic_variable<std::allocator<char>_> *)&local_98,'\x02');
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            ((basic_variable<std::allocator<char>_> *)local_48,
             (basic_variable<std::allocator<char>_> *)&local_98);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&local_98);
  local_9a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<bool>
                          ((basic_variable<std::allocator<char>_> *)local_48);
  local_9b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<bool>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x121,"void append_suite::append_boolean_with_integer()",local_9a,&local_9b);
  local_9d[0] = trial::dynamic::basic_variable<std::allocator<char>_>::value<bool>
                          ((basic_variable<std::allocator<char>_> *)local_48);
  local_9e = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.value<bool>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x122,"void append_suite::append_boolean_with_integer()",local_9d,&local_9e);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_48);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)local_d8,false);
  local_da[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<bool>
                          ((basic_variable<std::allocator<char>_> *)local_d8);
  local_db = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<bool>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x127,"void append_suite::append_boolean_with_integer()",local_da,&local_db);
  local_dd[0] = trial::dynamic::basic_variable<std::allocator<char>_>::value<bool>
                          ((basic_variable<std::allocator<char>_> *)local_d8);
  local_de = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.value<bool>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x128,"void append_suite::append_boolean_with_integer()",local_dd,&local_de);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_char>
            ((basic_variable<std::allocator<char>_> *)&value_2,'\x02');
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            ((basic_variable<std::allocator<char>_> *)local_d8,
             (basic_variable<std::allocator<char>_> *)&value_2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&value_2);
  local_11a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<bool>
                           ((basic_variable<std::allocator<char>_> *)local_d8);
  local_11b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<bool>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x12a,"void append_suite::append_boolean_with_integer()",local_11a,&local_11b);
  local_11d[0] = trial::dynamic::basic_variable<std::allocator<char>_>::value<bool>
                           ((basic_variable<std::allocator<char>_> *)local_d8);
  local_11e = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.value<bool>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,299,"void append_suite::append_boolean_with_integer()",local_11d,&local_11e);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)local_158,false);
  local_15a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<bool>
                           ((basic_variable<std::allocator<char>_> *)local_158);
  local_15b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<bool>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x130,"void append_suite::append_boolean_with_integer()",local_15a,&local_15b);
  local_15d[0] = trial::dynamic::basic_variable<std::allocator<char>_>::value<bool>
                           ((basic_variable<std::allocator<char>_> *)local_158);
  local_15e = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.value<bool>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x131,"void append_suite::append_boolean_with_integer()",local_15d,&local_15e);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<short>
            ((basic_variable<std::allocator<char>_> *)&value_3,2);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            ((basic_variable<std::allocator<char>_> *)local_158,
             (basic_variable<std::allocator<char>_> *)&value_3);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&value_3);
  local_19a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<bool>
                           ((basic_variable<std::allocator<char>_> *)local_158);
  local_19b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<bool>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x133,"void append_suite::append_boolean_with_integer()",local_19a,&local_19b);
  local_19d[0] = trial::dynamic::basic_variable<std::allocator<char>_>::value<bool>
                           ((basic_variable<std::allocator<char>_> *)local_158);
  local_19e = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.value<bool>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x134,"void append_suite::append_boolean_with_integer()",local_19d,&local_19e);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_158);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)local_1d8,false);
  local_1da[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<bool>
                           ((basic_variable<std::allocator<char>_> *)local_1d8);
  local_1db = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<bool>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x139,"void append_suite::append_boolean_with_integer()",local_1da,&local_1db);
  local_1dd[0] = trial::dynamic::basic_variable<std::allocator<char>_>::value<bool>
                           ((basic_variable<std::allocator<char>_> *)local_1d8);
  local_1de = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.value<bool>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x13a,"void append_suite::append_boolean_with_integer()",local_1dd,&local_1de);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_short>
            (&local_218,2);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            ((basic_variable<std::allocator<char>_> *)local_1d8,&local_218);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_218);
  value_4._2_1_ =
       trial::dynamic::basic_variable<std::allocator<char>_>::is<bool>
                 ((basic_variable<std::allocator<char>_> *)local_1d8);
  value_4._1_1_ = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<bool>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x13c,"void append_suite::append_boolean_with_integer()",(long)&value_4 + 2,
             (long)&value_4 + 1);
  local_21d = trial::dynamic::basic_variable<std::allocator<char>_>::value<bool>
                        ((basic_variable<std::allocator<char>_> *)local_1d8);
  local_21e = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.value<bool>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x13d,"void append_suite::append_boolean_with_integer()",&local_21d,&local_21e);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_1d8);
  data_4.storage._44_4_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)local_258,false);
  local_25a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<bool>
                           ((basic_variable<std::allocator<char>_> *)local_258);
  local_25b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<bool>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x142,"void append_suite::append_boolean_with_integer()",local_25a,&local_25b);
  local_25d[0] = trial::dynamic::basic_variable<std::allocator<char>_>::value<bool>
                           ((basic_variable<std::allocator<char>_> *)local_258);
  local_25e = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.value<bool>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x143,"void append_suite::append_boolean_with_integer()",local_25d,&local_25e);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            (&local_298,data_4.storage._44_4_);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            ((basic_variable<std::allocator<char>_> *)local_258,&local_298);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_298);
  value_5._2_1_ =
       trial::dynamic::basic_variable<std::allocator<char>_>::is<bool>
                 ((basic_variable<std::allocator<char>_> *)local_258);
  value_5._1_1_ = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<bool>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x145,"void append_suite::append_boolean_with_integer()",(long)&value_5 + 2,
             (long)&value_5 + 1);
  local_29d = trial::dynamic::basic_variable<std::allocator<char>_>::value<bool>
                        ((basic_variable<std::allocator<char>_> *)local_258);
  local_29e = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.value<bool>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x146,"void append_suite::append_boolean_with_integer()",&local_29d,&local_29e);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_258);
  data_5.storage._44_4_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)local_2d8,false);
  local_2da[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<bool>
                           ((basic_variable<std::allocator<char>_> *)local_2d8);
  local_2db = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<bool>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x14b,"void append_suite::append_boolean_with_integer()",local_2da,&local_2db);
  local_2dd[0] = trial::dynamic::basic_variable<std::allocator<char>_>::value<bool>
                           ((basic_variable<std::allocator<char>_> *)local_2d8);
  local_2de = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.value<bool>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x14c,"void append_suite::append_boolean_with_integer()",local_2dd,&local_2de);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>
            (&local_318,data_5.storage._44_4_);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            ((basic_variable<std::allocator<char>_> *)local_2d8,&local_318);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_318);
  value_6._6_1_ =
       trial::dynamic::basic_variable<std::allocator<char>_>::is<bool>
                 ((basic_variable<std::allocator<char>_> *)local_2d8);
  value_6._5_1_ = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<bool>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x14e,"void append_suite::append_boolean_with_integer()",(long)&value_6 + 6,
             (long)&value_6 + 5);
  value_6._3_1_ =
       trial::dynamic::basic_variable<std::allocator<char>_>::value<bool>
                 ((basic_variable<std::allocator<char>_> *)local_2d8);
  value_6._2_1_ = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.value<bool>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x14f,"void append_suite::append_boolean_with_integer()",(long)&value_6 + 3,
             (long)&value_6 + 2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_2d8);
  data_6.storage._40_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)local_358,false);
  local_35a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<bool>
                           ((basic_variable<std::allocator<char>_> *)local_358);
  local_35b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<bool>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x154,"void append_suite::append_boolean_with_integer()",local_35a,&local_35b);
  local_35d[0] = trial::dynamic::basic_variable<std::allocator<char>_>::value<bool>
                           ((basic_variable<std::allocator<char>_> *)local_358);
  local_35e = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.value<bool>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x155,"void append_suite::append_boolean_with_integer()",local_35d,&local_35e);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long>
            (&local_398,data_6.storage._40_8_);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            ((basic_variable<std::allocator<char>_> *)local_358,&local_398);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_398);
  value_7._6_1_ =
       trial::dynamic::basic_variable<std::allocator<char>_>::is<bool>
                 ((basic_variable<std::allocator<char>_> *)local_358);
  value_7._5_1_ = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<bool>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x157,"void append_suite::append_boolean_with_integer()",(long)&value_7 + 6,
             (long)&value_7 + 5);
  value_7._3_1_ =
       trial::dynamic::basic_variable<std::allocator<char>_>::value<bool>
                 ((basic_variable<std::allocator<char>_> *)local_358);
  value_7._2_1_ = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.value<bool>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x158,"void append_suite::append_boolean_with_integer()",(long)&value_7 + 3,
             (long)&value_7 + 2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_358);
  data_7.storage._40_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)local_3d8,false);
  local_3da[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<bool>
                           ((basic_variable<std::allocator<char>_> *)local_3d8);
  local_3db = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<bool>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x15d,"void append_suite::append_boolean_with_integer()",local_3da,&local_3db);
  local_3dd[0] = trial::dynamic::basic_variable<std::allocator<char>_>::value<bool>
                           ((basic_variable<std::allocator<char>_> *)local_3d8);
  local_3de = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.value<bool>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x15e,"void append_suite::append_boolean_with_integer()",local_3dd,&local_3de);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_long>
            (&local_418,data_7.storage._40_8_);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            ((basic_variable<std::allocator<char>_> *)local_3d8,&local_418);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_418);
  value_8._6_1_ =
       trial::dynamic::basic_variable<std::allocator<char>_>::is<bool>
                 ((basic_variable<std::allocator<char>_> *)local_3d8);
  value_8._5_1_ = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<bool>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x160,"void append_suite::append_boolean_with_integer()",(long)&value_8 + 6,
             (long)&value_8 + 5);
  value_8._3_1_ =
       trial::dynamic::basic_variable<std::allocator<char>_>::value<bool>
                 ((basic_variable<std::allocator<char>_> *)local_3d8);
  value_8._2_1_ = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.value<bool>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x161,"void append_suite::append_boolean_with_integer()",(long)&value_8 + 3,
             (long)&value_8 + 2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_3d8);
  data_8.storage._40_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)local_458,false);
  local_45a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<bool>
                           ((basic_variable<std::allocator<char>_> *)local_458);
  local_45b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<bool>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x166,"void append_suite::append_boolean_with_integer()",local_45a,&local_45b);
  local_45d[0] = trial::dynamic::basic_variable<std::allocator<char>_>::value<bool>
                           ((basic_variable<std::allocator<char>_> *)local_458);
  local_45e = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.value<bool>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x167,"void append_suite::append_boolean_with_integer()",local_45d,&local_45e);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_long>
            (&local_498,data_8.storage._40_8_);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            ((basic_variable<std::allocator<char>_> *)local_458,&local_498);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_498);
  value_9._6_1_ =
       trial::dynamic::basic_variable<std::allocator<char>_>::is<bool>
                 ((basic_variable<std::allocator<char>_> *)local_458);
  value_9._5_1_ = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<bool>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x169,"void append_suite::append_boolean_with_integer()",(long)&value_9 + 6,
             (long)&value_9 + 5);
  value_9._3_1_ =
       trial::dynamic::basic_variable<std::allocator<char>_>::value<bool>
                 ((basic_variable<std::allocator<char>_> *)local_458);
  value_9._2_1_ = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.value<bool>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x16a,"void append_suite::append_boolean_with_integer()",(long)&value_9 + 3,
             (long)&value_9 + 2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_458);
  data_9.storage._40_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)local_4d8,false);
  local_4da[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<bool>
                           ((basic_variable<std::allocator<char>_> *)local_4d8);
  local_4db = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<bool>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x16f,"void append_suite::append_boolean_with_integer()",local_4da,&local_4db);
  local_4dd[0] = trial::dynamic::basic_variable<std::allocator<char>_>::value<bool>
                           ((basic_variable<std::allocator<char>_> *)local_4d8);
  local_4de = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.value<bool>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x170,"void append_suite::append_boolean_with_integer()",local_4dd,&local_4de);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_long_long>
            (&local_518,data_9.storage._40_8_);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            ((basic_variable<std::allocator<char>_> *)local_4d8,&local_518);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_518);
  local_51a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<bool>
                           ((basic_variable<std::allocator<char>_> *)local_4d8);
  local_51b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<bool>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x172,"void append_suite::append_boolean_with_integer()",local_51a,&local_51b);
  local_51d[0] = trial::dynamic::basic_variable<std::allocator<char>_>::value<bool>
                           ((basic_variable<std::allocator<char>_> *)local_4d8);
  local_51e = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.value<bool>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x173,"void append_suite::append_boolean_with_integer()",local_51d,&local_51e);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_4d8);
  return;
}

Assistant:

void append_boolean_with_integer()
{
    {
        signed char value = 2;
        variable data(false);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<bool>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<bool>(), false);
        data += variable(value);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<bool>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<bool>(), true);
    }
    {
        unsigned char value = 2;
        variable data(false);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<bool>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<bool>(), false);
        data += variable(value);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<bool>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<bool>(), true);
    }
    {
        signed short int value = 2;
        variable data(false);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<bool>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<bool>(), false);
        data += variable(value);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<bool>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<bool>(), true);
    }
    {
        unsigned short int value = 2;
        variable data(false);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<bool>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<bool>(), false);
        data += variable(value);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<bool>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<bool>(), true);
    }
    {
        signed int value = 2;
        variable data(false);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<bool>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<bool>(), false);
        data += variable(value);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<bool>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<bool>(), true);
    }
    {
        unsigned int value = 2;
        variable data(false);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<bool>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<bool>(), false);
        data += variable(value);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<bool>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<bool>(), true);
    }
    {
        signed long int value = 2;
        variable data(false);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<bool>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<bool>(), false);
        data += variable(value);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<bool>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<bool>(), true);
    }
    {
        unsigned long int value = 2;
        variable data(false);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<bool>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<bool>(), false);
        data += variable(value);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<bool>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<bool>(), true);
    }
    {
        signed long long int value = 2;
        variable data(false);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<bool>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<bool>(), false);
        data += variable(value);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<bool>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<bool>(), true);
    }
    {
        unsigned long long int value = 2;
        variable data(false);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<bool>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<bool>(), false);
        data += variable(value);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<bool>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<bool>(), true);
    }
}